

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

torrent_peer * __thiscall
libtorrent::peer_list::add_peer
          (peer_list *this,endpoint *remote,peer_source_flags_t src,pex_flags_t flags,
          torrent_state *state)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  undefined4 extraout_var;
  reference pptVar4;
  bool bVar5;
  match_peer_endpoint __pred;
  bool local_26b;
  bool local_26a;
  exception *anon_var_0;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_238;
  uchar local_213;
  uchar local_212;
  byte local_211;
  undefined1 local_210 [7];
  bool is_v6;
  iterator local_1f0;
  iterator local_1c8;
  iterator local_1a8;
  torrent_peer *local_188;
  _Elt_pointer local_180;
  _Elt_pointer local_178;
  _Elt_pointer local_170;
  match_peer_endpoint local_168;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_158;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_138;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_118;
  undefined1 local_f8 [8];
  pair<std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>,_std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>_>
  range;
  ipv4_peer *piStack_b0;
  bool found;
  torrent_peer *p;
  iterator iter;
  address local_70;
  undefined1 local_50 [8];
  address remote_address;
  torrent_state *state_local;
  endpoint *remote_local;
  peer_list *this_local;
  pex_flags_t flags_local;
  ipv4_peer *piStack_10;
  peer_source_flags_t src_local;
  
  remote_address.ipv6_address_.scope_id_ = (unsigned_long)state;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address((address *)local_50,remote);
  boost::asio::ip::address::address(&local_70);
  bVar1 = boost::asio::ip::operator==((address *)local_50,&local_70);
  bVar5 = true;
  if (!bVar1) {
    uVar2 = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(remote);
    bVar5 = uVar2 == 0;
  }
  if (bVar5) {
    piStack_10 = (ipv4_peer *)0x0;
  }
  else {
    bVar5 = boost::asio::ip::address::is_v6((address *)local_50);
    local_26a = false;
    if (bVar5) {
      boost::asio::ip::address::to_v6((address_v6 *)&iter._M_node,(address *)local_50);
      local_26a = boost::asio::ip::address_v6::is_link_local((address_v6 *)&iter._M_node);
    }
    if (local_26a == false) {
      std::
      _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
      ::_Deque_iterator((_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                         *)&p);
      range.second._M_node._7_1_ = 0;
      if ((*(byte *)(remote_address.ipv6_address_.scope_id_ + 2) & 1) == 0) {
        std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::begin
                  (&local_1a8,
                   (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *
                   )this);
        std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::end
                  (&local_1c8,
                   (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *
                   )this);
        std::
        lower_bound<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,boost::asio::ip::address,libtorrent::peer_address_compare>
                  (&local_188,&local_1a8,&local_1c8,local_50);
        p = local_188;
        iter._M_cur = local_180;
        iter._M_first = local_178;
        iter._M_last = local_170;
        std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::end
                  (&local_1f0,
                   (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *
                   )this);
        bVar5 = std::operator!=((_Self *)&p,&local_1f0);
        local_26b = false;
        if (bVar5) {
          pptVar4 = std::
                    _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                    ::operator*((_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                                 *)&p);
          torrent_peer::address((address *)local_210,*pptVar4);
          local_26b = boost::asio::ip::operator==((address *)local_210,(address *)local_50);
        }
        if (local_26b != false) {
          range.second._M_node._7_1_ = 1;
        }
      }
      else {
        find_peers((pair<std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>,_std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>_>
                    *)local_f8,this,(address *)local_50);
        std::
        _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
        ::_Deque_iterator(&local_138,
                          (_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                           *)local_f8);
        std::
        _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
        ::_Deque_iterator(&local_158,
                          (_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                           *)&range.first._M_node);
        uVar2 = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(remote);
        anon_unknown.dwarf_59aa8a::match_peer_endpoint::match_peer_endpoint
                  (&local_168,(address *)local_50,uVar2);
        __pred.m_port = local_168.m_port;
        __pred.m_addr = local_168.m_addr;
        __pred._10_6_ = 0;
        std::
        find_if<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,(anonymous_namespace)::match_peer_endpoint>
                  (&local_118,&local_138,&local_158,__pred);
        p = (torrent_peer *)local_118._M_cur;
        iter._M_cur = local_118._M_first;
        iter._M_first = local_118._M_last;
        iter._M_last = (_Elt_pointer)local_118._M_node;
        bVar5 = std::operator!=((_Self *)&p,(_Self *)&range.first._M_node);
        if (bVar5) {
          range.second._M_node._7_1_ = 1;
        }
      }
      if ((range.second._M_node._7_1_ & 1) == 0) {
        local_211 = boost::asio::ip::address::is_v6((address *)local_50);
        iVar3 = (**this->m_peer_allocator->_vptr_torrent_peer_allocator_interface)
                          (this->m_peer_allocator,(ulong)local_211);
        piStack_b0 = (ipv4_peer *)CONCAT44(extraout_var,iVar3);
        if (piStack_b0 == (ipv4_peer *)0x0) {
          return (torrent_peer *)0x0;
        }
        if ((local_211 & 1) == 0) {
          local_213 = src.m_val;
          ipv4_peer::ipv4_peer(piStack_b0,remote,true,src);
        }
        else {
          local_212 = src.m_val;
          ipv6_peer::ipv6_peer((ipv6_peer *)piStack_b0,remote,true,src);
        }
        std::
        _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
        ::_Deque_iterator(&local_238,
                          (_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                           *)&p);
        bVar5 = insert_peer(this,(torrent_peer *)piStack_b0,&local_238,flags,
                            (torrent_state *)remote_address.ipv6_address_.scope_id_);
        if (!bVar5) {
          (*this->m_peer_allocator->_vptr_torrent_peer_allocator_interface[1])
                    (this->m_peer_allocator,piStack_b0);
          return (torrent_peer *)0x0;
        }
        *(undefined1 *)(remote_address.ipv6_address_.scope_id_ + 3) = 1;
      }
      else {
        pptVar4 = std::
                  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                  ::operator*((_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
                               *)&p);
        piStack_b0 = (ipv4_peer *)*pptVar4;
        update_peer(this,(torrent_peer *)piStack_b0,src,flags,remote);
        *(undefined1 *)(remote_address.ipv6_address_.scope_id_ + 3) = 0;
      }
      piStack_10 = piStack_b0;
    }
    else {
      piStack_10 = (ipv4_peer *)0x0;
    }
  }
  return &piStack_10->super_torrent_peer;
}

Assistant:

torrent_peer* peer_list::add_peer(tcp::endpoint const& remote
		, peer_source_flags_t const src, pex_flags_t const flags
		, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto const remote_address = remote.address();

		// just ignore the obviously invalid entries
		if (remote_address == address() || remote.port() == 0)
			return nullptr;

		// don't allow link-local IPv6 addresses since they
		// can't be used like normal addresses, they require an interface
		// and will just cause connect() to fail with EINVAL
		if (remote_address.is_v6() && remote_address.to_v6().is_link_local())
			return nullptr;

		iterator iter;
		torrent_peer* p = nullptr;

		bool found = false;
		if (state->allow_multiple_connections_per_ip)
		{
			auto const range = find_peers(remote_address);
			iter = std::find_if(range.first, range.second
				, match_peer_endpoint(remote_address, remote.port()));
			if (iter != range.second) found = true;
		}
		else
		{
			iter = std::lower_bound(m_peers.begin(), m_peers.end()
				, remote_address, peer_address_compare());

			if (iter != m_peers.end() && (*iter)->address() == remote_address) found = true;
		}

		if (!found)
		{
			// we don't have any info about this peer.
			// add a new entry

			bool const is_v6 = remote_address.is_v6();
			p = m_peer_allocator.allocate_peer_entry(
				is_v6 ? torrent_peer_allocator_interface::ipv6_peer_type
				: torrent_peer_allocator_interface::ipv4_peer_type);
			if (p == nullptr) return nullptr;

			if (is_v6)
				p = new (p) ipv6_peer(remote, true, src);
			else
				p = new (p) ipv4_peer(remote, true, src);

			try
			{
				if (!insert_peer(p, iter, flags, state))
				{
					m_peer_allocator.free_peer_entry(p);
					return nullptr;
				}
			}
			catch (std::exception const&)
			{
				m_peer_allocator.free_peer_entry(p);
				return nullptr;
			}
			state->first_time_seen = true;
		}
		else
		{
			p = *iter;
			TORRENT_ASSERT(p->in_use);
			update_peer(p, src, flags, remote);
			state->first_time_seen = false;
		}

		return p;
	}